

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O0

void __thiscall Pl_LZWDecoder::handleCode(Pl_LZWDecoder *this,uint code)

{
  bool bVar1;
  uint uVar2;
  runtime_error *prVar3;
  Pipeline *pPVar4;
  size_type sVar5;
  reference this_00;
  uchar *puVar6;
  size_t sVar7;
  Buffer *b;
  undefined1 local_45;
  uint idx_1;
  int iStack_40;
  uchar ch;
  uint change_idx;
  uint new_idx;
  ulong local_30;
  size_t idx;
  uint local_1c;
  uchar local_15;
  uint table_size;
  uchar next_c;
  Pl_LZWDecoder *pPStack_10;
  uint code_local;
  Pl_LZWDecoder *this_local;
  
  if ((this->eod & 1U) == 0) {
    table_size = code;
    pPStack_10 = this;
    if (code == 0x100) {
      bVar1 = std::vector<Buffer,_std::allocator<Buffer>_>::empty(&this->table);
      if (!bVar1) {
        QTC::TC("libtests","Pl_LZWDecoder intermediate reset",0);
      }
      std::vector<Buffer,_std::allocator<Buffer>_>::clear(&this->table);
      this->code_size = 9;
    }
    else if (code == 0x101) {
      this->eod = true;
    }
    else {
      if (this->last_code != 0x100) {
        local_15 = '\0';
        idx = std::vector<Buffer,_std::allocator<Buffer>_>::size(&this->table);
        local_1c = QIntC::to_uint<unsigned_long>(&idx);
        if (table_size < 0x100) {
          local_15 = (uchar)table_size;
        }
        else if (0x101 < table_size) {
          local_30 = (ulong)(table_size - 0x102);
          if (local_1c < local_30) {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"LZWDecoder: bad code received");
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (local_30 == local_1c) {
            QTC::TC("libtests","Pl_LZWDecoder last was table size",0);
            local_15 = getFirstChar(this,this->last_code);
          }
          else {
            local_15 = getFirstChar(this,table_size);
          }
        }
        iStack_40 = local_1c + 0x102;
        if (iStack_40 == 0x1000) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"LZWDecoder: table full");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        addToTable(this,local_15);
        idx_1 = iStack_40 + (uint)(this->code_change_delta & 1);
        if (((idx_1 == 0x1ff) || (idx_1 == 0x3ff)) || (idx_1 == 0x7ff)) {
          this->code_size = this->code_size + 1;
        }
      }
      if (table_size < 0x100) {
        local_45 = (undefined1)table_size;
        pPVar4 = Pipeline::next(&this->super_Pipeline);
        (*pPVar4->_vptr_Pipeline[2])(pPVar4,&local_45,1);
      }
      else {
        uVar2 = table_size - 0x102;
        sVar5 = std::vector<Buffer,_std::allocator<Buffer>_>::size(&this->table);
        if (sVar5 <= uVar2) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Pl_LZWDecoder::handleCode: table overflow");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this_00 = std::vector<Buffer,_std::allocator<Buffer>_>::at(&this->table,(ulong)uVar2);
        pPVar4 = Pipeline::next(&this->super_Pipeline);
        puVar6 = Buffer::getBuffer(this_00);
        sVar7 = Buffer::getSize(this_00);
        (*pPVar4->_vptr_Pipeline[2])(pPVar4,puVar6,sVar7);
      }
    }
    this->last_code = table_size;
  }
  return;
}

Assistant:

void
Pl_LZWDecoder::handleCode(unsigned int code)
{
    if (this->eod) {
        return;
    }

    if (code == 256) {
        if (!this->table.empty()) {
            QTC::TC("libtests", "Pl_LZWDecoder intermediate reset");
        }
        this->table.clear();
        this->code_size = 9;
    } else if (code == 257) {
        this->eod = true;
    } else {
        if (this->last_code != 256) {
            // Add to the table from last time.  New table entry would be what we read last plus the
            // first character of what we're reading now.
            unsigned char next_c = '\0';
            unsigned int table_size = QIntC::to_uint(table.size());
            if (code < 256) {
                // just read < 256; last time's next_c was code
                next_c = static_cast<unsigned char>(code);
            } else if (code > 257) {
                size_t idx = code - 258;
                if (idx > table_size) {
                    throw std::runtime_error("LZWDecoder: bad code received");
                } else if (idx == table_size) {
                    // The encoder would have just created this entry, so the first character of
                    // this entry would have been the same as the first character of the last entry.
                    QTC::TC("libtests", "Pl_LZWDecoder last was table size");
                    next_c = getFirstChar(this->last_code);
                } else {
                    next_c = getFirstChar(code);
                }
            }
            unsigned int new_idx = 258 + table_size;
            if (new_idx == 4096) {
                throw std::runtime_error("LZWDecoder: table full");
            }
            addToTable(next_c);
            unsigned int change_idx = new_idx + code_change_delta;
            if ((change_idx == 511) || (change_idx == 1023) || (change_idx == 2047)) {
                ++this->code_size;
            }
        }

        if (code < 256) {
            auto ch = static_cast<unsigned char>(code);
            next()->write(&ch, 1);
        } else {
            unsigned int idx = code - 258;
            if (idx >= table.size()) {
                throw std::runtime_error("Pl_LZWDecoder::handleCode: table overflow");
            }
            Buffer& b = table.at(idx);
            next()->write(b.getBuffer(), b.getSize());
        }
    }

    this->last_code = code;
}